

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

string * __thiscall
cmCTestP4::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestP4 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  allocator<char> local_1c9;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_identify;
  string rev;
  string source;
  OutputLogger err;
  IdentifyParser out;
  
  p4_identify.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  p4_identify.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p4_identify.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetP4Options(this,&p4_identify);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)anon_var_dwarf_1bef34f;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_identify,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)anon_var_dwarf_1bef2b4;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_identify,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x6cd788;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_identify,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)anon_var_dwarf_a42b6f;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_identify,(char **)&out);
  std::operator+(&source,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...#have")
  ;
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)source._M_dataplus._M_p
  ;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_identify,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&p4_identify,(char **)&out);
  paVar1 = &rev.field_2;
  rev._M_string_length = 0;
  rev.field_2._M_local_buf[0] = '\0';
  rev._M_dataplus._M_p = (pointer)paVar1;
  IdentifyParser::IdentifyParser(&out,this,"p4_changes-out> ",&rev);
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_changes-err> ");
  bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,
                              p4_identify.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&out,
                              (OutputParser *)&err,(char *)0x0,Auto);
  if (bVar2) {
    if (rev._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"0",&local_1c9);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rev._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(rev.field_2._M_allocated_capacity._1_7_,rev.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = rev.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = rev._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(rev.field_2._M_allocated_capacity._1_7_,rev.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = rev._M_string_length;
      rev._M_string_length = 0;
      rev.field_2._M_local_buf[0] = '\0';
      rev._M_dataplus._M_p = (pointer)paVar1;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<unknown>",&local_1c9);
  }
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  IdentifyParser::~IdentifyParser(&out);
  std::__cxx11::string::~string((string *)&rev);
  std::__cxx11::string::~string((string *)&source);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&p4_identify.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestP4::GetWorkingRevision()
{
  std::vector<char const*> p4_identify;
  this->SetP4Options(p4_identify);

  p4_identify.push_back("changes");
  p4_identify.push_back("-m");
  p4_identify.push_back("1");
  p4_identify.push_back("-t");

  std::string source = this->SourceDirectory + "/...#have";
  p4_identify.push_back(source.c_str());
  p4_identify.push_back(nullptr);

  std::string rev;
  IdentifyParser out(this, "p4_changes-out> ", rev);
  OutputLogger err(this->Log, "p4_changes-err> ");

  bool result = this->RunChild(p4_identify.data(), &out, &err);

  // If there was a problem contacting the server return "<unknown>"
  if (!result) {
    return "<unknown>";
  }

  if (rev.empty()) {
    return "0";
  }
  return rev;
}